

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O3

FileInfo * __thiscall llbuild::buildsystem::BuildValue::getOutputInfo(BuildValue *this)

{
  if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    if (this->numOutputInfos < 2) {
      return (FileInfo *)&this->valueData;
    }
    __assert_fail("!hasMultipleOutputs() && \"invalid call on result with multiple outputs\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0x18d,"const FileInfo &llbuild::buildsystem::BuildValue::getOutputInfo() const");
  }
  __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0x18b,"const FileInfo &llbuild::buildsystem::BuildValue::getOutputInfo() const");
}

Assistant:

const FileInfo& getOutputInfo() const {
    assert(kindHasOutputInfo() && "invalid call for value kind");
    assert(!hasMultipleOutputs() &&
           "invalid call on result with multiple outputs");
    return valueData.asOutputInfo;
  }